

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classmetadata.cpp
# Opt level: O2

bool stackjit::fromString(string *str,AccessModifier *accessModifier)

{
  bool bVar1;
  AccessModifier AVar2;
  
  bVar1 = std::operator==(str,"public");
  AVar2 = Public;
  if (!bVar1) {
    bVar1 = std::operator==(str,"private");
    AVar2 = Private;
    if (!bVar1) {
      return false;
    }
  }
  *accessModifier = AVar2;
  return true;
}

Assistant:

bool fromString(std::string str, AccessModifier& accessModifier) {
		if (str == "public") {
			accessModifier = AccessModifier::Public;
			return true;
		} else if (str == "private") {
			accessModifier = AccessModifier::Private;
			return true;
		}

		return false;
	}